

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O3

RTMatrix4x4 * __thiscall
RTMatrix4x4::transposed(RTMatrix4x4 *__return_storage_ptr__,RTMatrix4x4 *this)

{
  int row;
  long lVar1;
  RTFLOAT *pRVar2;
  long lVar3;
  
  RTMatrix4x4(__return_storage_ptr__);
  lVar1 = 0;
  pRVar2 = (RTFLOAT *)__return_storage_ptr__;
  do {
    lVar3 = 0;
    do {
      pRVar2[lVar3] =
           (RTFLOAT)*(undefined4 *)((long)*(RTFLOAT (*) [4])*(RTFLOAT (*) [4])this + lVar3);
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x10);
    lVar1 = lVar1 + 1;
    this = (RTMatrix4x4 *)((long)this + 0x10);
    pRVar2 = pRVar2 + 1;
  } while (lVar1 != 4);
  return __return_storage_ptr__;
}

Assistant:

RTMatrix4x4 RTMatrix4x4::transposed()
{
    RTMatrix4x4 res;

    for (int row = 0; row < 4; row++)
        for (int col = 0; col < 4; col++)
            res.m_data[col][row] = m_data[row][col];
    return res;
}